

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tictoc.h
# Opt level: O1

void __thiscall bsplib::TicToc::~TicToc(TicToc *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *plVar6;
  Time t;
  timespec local_40;
  
  lVar3 = s_timers;
  lVar5 = (ulong)this->m_record * 0x20;
  lVar1 = *(long *)(s_timers + lVar5);
  lVar2 = *(long *)(s_timers + 8 + lVar5);
  clock_gettime(1,&local_40);
  lVar4 = local_40.tv_sec - (this->m_start).tv_sec;
  local_40.tv_nsec = local_40.tv_nsec - (this->m_start).tv_nsec;
  if (local_40.tv_nsec < 1000000000) {
    if (local_40.tv_nsec < 0) {
      lVar4 = lVar4 + -1;
      local_40.tv_nsec = local_40.tv_nsec + 1000000000;
    }
  }
  else {
    lVar4 = lVar4 + 1;
    local_40.tv_nsec = local_40.tv_nsec + -1000000000;
  }
  local_40.tv_nsec = local_40.tv_nsec + lVar2;
  lVar4 = lVar4 + lVar1;
  plVar6 = (long *)(lVar3 + lVar5);
  if (local_40.tv_nsec < 1000000000) {
    if (local_40.tv_nsec < 0) {
      lVar4 = lVar4 + -1;
      local_40.tv_nsec = local_40.tv_nsec + 1000000000;
    }
  }
  else {
    lVar4 = lVar4 + 1;
    local_40.tv_nsec = local_40.tv_nsec + -1000000000;
  }
  *plVar6 = lVar4;
  plVar6[1] = local_40.tv_nsec;
  plVar6[2] = plVar6[2] + this->m_nbytes;
  plVar6[3] = plVar6[3] + 1;
  pop();
  return;
}

Assistant:

~TicToc()
    {
        Record & r = s_timers[m_record];
        r.time = timeAdd( r.time, 
                timeDiff( getTime(), m_start ) );
        r.nbytes += m_nbytes;
        r.count += 1;
        pop();
    }